

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_post_process<ncnn::post_process_sqrt<float>>(Mat *a,float coeff,Option *opt)

{
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  int i_3;
  float *outptr;
  int q;
  int i_2;
  int size_1;
  int c;
  int i_1;
  int size;
  int i;
  int w;
  int dims;
  post_process_sqrt<float> mathop;
  Mat *m;
  int local_19c;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined4 local_180;
  long local_178;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined8 local_158;
  long local_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  post_process_sqrt<float> local_121 [13];
  float local_114;
  long *local_110;
  undefined8 *local_108;
  undefined8 *local_f8;
  long local_e8;
  long local_d8;
  long *local_d0;
  long local_c8;
  long local_b8;
  long *local_b0;
  long local_a8;
  long local_98;
  long *local_90;
  undefined1 local_85;
  int local_84;
  undefined8 *local_78;
  undefined8 *local_50;
  long local_48;
  undefined4 local_3c;
  long local_38;
  long local_30;
  undefined4 local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_128 = (int)in_RDI[5];
  local_114 = in_XMM0_Da;
  local_110 = in_RDI;
  if (local_128 == 1) {
    local_12c = *(int *)((long)in_RDI + 0x2c);
    local_128 = 1;
    for (local_130 = 0; local_130 < local_12c; local_130 = local_130 + 1) {
      local_98 = (long)local_130;
      local_90 = local_110;
      fVar1 = post_process_sqrt<float>::operator()(local_121,(float *)(*local_110 + local_98 * 4));
      local_a8 = (long)local_130;
      *(float *)(*local_110 + local_a8 * 4) = fVar1 * local_114;
    }
  }
  else if (local_128 == 2) {
    local_134 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6];
    local_128 = 2;
    for (local_138 = 0; local_138 < local_134; local_138 = local_138 + 1) {
      local_b8 = (long)local_138;
      local_b0 = local_110;
      fVar1 = post_process_sqrt<float>::operator()(local_121,(float *)(*local_110 + local_b8 * 4));
      local_c8 = (long)local_138;
      *(float *)(*local_110 + local_c8 * 4) = fVar1 * local_114;
    }
  }
  else if ((local_128 == 3) || (local_128 == 4)) {
    local_13c = (int)in_RDI[7];
    local_140 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34);
    if (local_13c == 1) {
      local_13c = 1;
      for (local_144 = 0; local_144 < local_140; local_144 = local_144 + 1) {
        local_d8 = (long)local_144;
        local_d0 = local_110;
        fVar1 = post_process_sqrt<float>::operator()(local_121,(float *)(*local_110 + local_d8 * 4))
        ;
        local_e8 = (long)local_144;
        *(float *)(*local_110 + local_e8 * 4) = fVar1 * local_114;
      }
    }
    else {
      for (local_148 = 0; local_148 < local_13c; local_148 = local_148 + 1) {
        local_78 = &local_198;
        local_1c = *(int *)((long)local_110 + 0x2c);
        local_20 = (int)local_110[6];
        local_24 = *(undefined4 *)((long)local_110 + 0x34);
        local_150 = *local_110 + local_110[8] * (long)local_148 * local_110[2];
        local_38 = local_110[2];
        local_3c = (undefined4)local_110[3];
        local_48 = local_110[4];
        local_18 = &local_198;
        local_8 = (long)local_1c * (long)local_20 * local_38;
        local_50 = &local_198;
        local_108 = &local_198;
        local_c = 0x10;
        local_84 = local_148;
        local_85 = 1;
        local_198 = 0;
        local_188 = 0;
        local_180 = 0;
        local_170 = 0;
        local_16c = 0;
        local_168 = 0;
        local_164 = 0;
        local_160 = 0;
        local_158 = 0;
        local_190 = 0;
        local_f8 = local_108;
        local_30 = local_150;
        local_178 = local_48;
        for (local_19c = 0; local_19c < local_140; local_19c = local_19c + 1) {
          fVar1 = post_process_sqrt<float>::operator()
                            (local_121,(float *)(local_150 + (long)local_19c * 4));
          *(float *)(local_150 + (long)local_19c * 4) = fVar1 * local_114;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3 || dims == 4)
    {
        int c = a.c;
        int size = a.w * a.h * a.d;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}